

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-product.c
# Opt level: O3

int coda_get_product_file_size(coda_product *product,int64_t *file_size)

{
  undefined8 uVar1;
  char *message;
  
  if (product == (coda_product *)0x0) {
    message = "product file argument is NULL (%s:%u)";
    uVar1 = 0x369;
  }
  else {
    if (file_size != (int64_t *)0x0) {
      *file_size = product->file_size;
      return 0;
    }
    message = "file_size argument is NULL (%s:%u)";
    uVar1 = 0x36e;
  }
  coda_set_error(-100,message,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                 ,uVar1);
  return -1;
}

Assistant:

LIBCODA_API int coda_get_product_file_size(const coda_product *product, int64_t *file_size)
{
    if (product == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "product file argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (file_size == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "file_size argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    *file_size = product->file_size;

    return 0;
}